

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O0

void __thiscall CProjectile::Snap(CProjectile *this,int SnappingClient)

{
  int iVar1;
  uint uVar2;
  IServer *pIVar3;
  CProjectile *this_00;
  undefined4 extraout_var;
  float in_ESI;
  CEntity *in_RDI;
  vec2 CheckPos;
  CNetObj_Projectile *pProj;
  float Ct;
  CNetObj_Projectile *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  CProjectile *in_stack_ffffffffffffffe0;
  
  pIVar3 = CEntity::Server((CEntity *)0x11e3e0);
  IServer::Tick(pIVar3);
  pIVar3 = CEntity::Server((CEntity *)0x11e401);
  IServer::TickSpeed(pIVar3);
  CheckPos = GetPos(in_stack_ffffffffffffffe0,in_ESI);
  iVar1 = CEntity::NetworkClipped
                    ((CEntity *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                     (int)((ulong)in_RDI >> 0x20),CheckPos);
  if (iVar1 == 0) {
    this_00 = (CProjectile *)CEntity::Server((CEntity *)0x11e460);
    uVar2 = CEntity::GetID(in_RDI);
    iVar1 = (*(this_00->super_CEntity)._vptr_CEntity[0x10])(this_00,2,(ulong)uVar2,0x18);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      FillInfo(this_00,in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void CProjectile::Snap(int SnappingClient)
{
	float Ct = (Server()->Tick()-m_StartTick)/(float)Server()->TickSpeed();

	if(NetworkClipped(SnappingClient, GetPos(Ct)))
		return;

	CNetObj_Projectile *pProj = static_cast<CNetObj_Projectile *>(Server()->SnapNewItem(NETOBJTYPE_PROJECTILE, GetID(), sizeof(CNetObj_Projectile)));
	if(pProj)
		FillInfo(pProj);
}